

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

Float __thiscall pbrt::PMJ02BNSampler::Get1D(PMJ02BNSampler *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  
  uVar1 = (this->pixel).super_Tuple2<pbrt::Point2,_int>.x;
  uVar2 = (this->pixel).super_Tuple2<pbrt::Point2,_int>.y;
  uVar3 = this->dimension;
  uVar9 = (long)*(int *)(Options + 4) ^
          (long)(int)uVar3 << 0x10 ^ (ulong)uVar2 << 0x20 ^ (ulong)uVar1 << 0x30;
  uVar9 = (uVar9 >> 0x1f ^ uVar9) * 0x7fb5d329728ea185;
  lVar10 = (uVar9 >> 0x1b ^ uVar9) * -0x7e25210b43d22bb3;
  uVar8 = (uint)((ulong)lVar10 >> 0x21) ^ (uint)lVar10;
  uVar7 = this->sampleIndex;
  uVar4 = this->samplesPerPixel;
  uVar11 = uVar4 - 1 >> 1 | uVar4 - 1;
  uVar11 = uVar11 >> 2 | uVar11;
  uVar11 = uVar11 >> 4 | uVar11;
  uVar11 = uVar11 >> 8 | uVar11;
  uVar11 = uVar11 >> 0x10 | uVar11;
  do {
    uVar7 = (uVar7 ^ uVar8) * -0x1e8f76c3 ^ uVar8 >> 0x10;
    uVar7 = ((uVar7 & uVar11) >> 4 ^ uVar8 >> 8 ^ uVar7) * 0x929eb3f ^ uVar8 >> 0x17;
    uVar7 = ((uVar7 & uVar11) >> 1 ^ uVar7) * (uVar8 >> 0x1b | 1) * 0x6935fa69;
    uVar7 = ((uVar7 & uVar11) >> 0xb ^ uVar7) * 0x74dcb303;
    uVar7 = ((uVar7 & uVar11) >> 2 ^ uVar7) * -0x61afe33d;
    uVar7 = ((uVar7 & uVar11) >> 2 ^ uVar7) * -0x379f5c21 & uVar11;
    uVar7 = uVar7 >> 5 ^ uVar7;
  } while (uVar4 <= uVar7);
  if (-1 < (int)(uVar1 | uVar2 | uVar3)) {
    auVar12._0_4_ =
         ((float)*(ushort *)
                  (BlueNoiseTextures +
                  (ulong)(uVar2 & 0x7f) * 2 +
                  (ulong)((uVar1 & 0x7f) << 8) + (ulong)(uVar3 % 0x30 << 0xf)) / 65535.0 +
         (float)(int)((uVar7 + uVar8) % uVar4)) / (float)(int)uVar4;
    auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
    uVar5 = vcmpss_avx512f(auVar12,ZEXT416(0x3f800000),9);
    bVar6 = (bool)((byte)uVar5 & 1);
    this->dimension = uVar3 + 1;
    auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)bVar6 * (int)auVar12._0_4_ +
                                 (uint)!bVar6 * (int)(auVar12._0_4_ + -1.0)));
    return auVar12._0_4_;
  }
  LogFatal<char_const(&)[40]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/bluenoise.h"
             ,0x17,"Check failed: %s",(char (*) [40])"textureIndex >= 0 && px >= 0 && py >= 0");
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);

        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);
        Float cpOffset = BlueNoise(dimension, pixel.x, pixel.y);
        Float u = (index + cpOffset) / samplesPerPixel;
        if (u >= 1)
            u -= 1;
        ++dimension;
        return std::min(u, OneMinusEpsilon);
    }